

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O0

bool __thiscall Glucose::SimpSolver::eliminateVar(SimpSolver *this,Var v)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  Lit LVar4;
  char *pcVar5;
  vec<Glucose::Solver::Watcher> *pvVar6;
  Var in_ESI;
  long *in_RDI;
  int i_5;
  int j_1;
  int i_4;
  vec<Glucose::Lit> *resolvent;
  int i_3;
  int i_2;
  int j;
  int i_1;
  int clause_size;
  int cnt;
  int i;
  vec<unsigned_int> neg;
  vec<unsigned_int> pos;
  vec<unsigned_int> *cls;
  undefined4 in_stack_fffffffffffffd48;
  Ref in_stack_fffffffffffffd4c;
  undefined1 dealloc;
  OccLists<int,_Glucose::vec<unsigned_int>,_Glucose::SimpSolver::ClauseDeleted>
  *in_stack_fffffffffffffd50;
  undefined4 in_stack_fffffffffffffd58;
  Var in_stack_fffffffffffffd5c;
  Solver *in_stack_fffffffffffffd60;
  OccLists<Glucose::Lit,_Glucose::vec<Glucose::Solver::Watcher>,_Glucose::Solver::WatcherDeleted>
  *this_00;
  Clause *in_stack_fffffffffffffd80;
  undefined1 in_stack_fffffffffffffd8b;
  CRef in_stack_fffffffffffffd8c;
  SimpSolver *in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffdb8;
  undefined4 in_stack_fffffffffffffdbc;
  undefined8 in_stack_fffffffffffffdc0;
  vec<Glucose::Lit> *in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffdd0;
  Var in_stack_fffffffffffffdd4;
  undefined4 in_stack_fffffffffffffdd8;
  undefined2 in_stack_fffffffffffffddc;
  byte in_stack_fffffffffffffdde;
  undefined1 in_stack_fffffffffffffddf;
  Clause *in_stack_fffffffffffffde0;
  undefined1 verbose;
  SimpSolver *in_stack_fffffffffffffde8;
  int local_94;
  int local_90;
  int local_8c;
  int local_74;
  int local_6c;
  int local_64;
  int local_60;
  int local_58;
  int local_50;
  vec<unsigned_int> local_40;
  vec<unsigned_int> local_30;
  vec<unsigned_int> *local_20;
  Var local_14;
  bool local_1;
  
  local_14 = in_ESI;
  local_20 = OccLists<int,_Glucose::vec<unsigned_int>,_Glucose::SimpSolver::ClauseDeleted>::lookup
                       ((OccLists<int,_Glucose::vec<unsigned_int>,_Glucose::SimpSolver::ClauseDeleted>
                         *)in_stack_fffffffffffffd60,
                        (int *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
  vec<unsigned_int>::vec(&local_30);
  vec<unsigned_int>::vec(&local_40);
  for (local_50 = 0; iVar2 = vec<unsigned_int>::size(local_20), local_50 < iVar2;
      local_50 = local_50 + 1) {
    vec<unsigned_int>::operator[](local_20,local_50);
    ClauseAllocator::operator[]
              ((ClauseAllocator *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd4c);
    mkLit(local_14,false);
    find<Glucose::Clause,Glucose::Lit>
              ((Clause *)in_stack_fffffffffffffd60,
               (Lit *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
    vec<unsigned_int>::operator[](local_20,local_50);
    vec<unsigned_int>::push
              ((vec<unsigned_int> *)in_stack_fffffffffffffd50,
               (uint *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
  }
  local_58 = 0;
  local_60 = 0;
  do {
    iVar2 = vec<unsigned_int>::size(&local_30);
    if (iVar2 <= local_60) {
      pcVar5 = vec<char>::operator[]((vec<char> *)(in_RDI + 0xb2),local_14);
      *pcVar5 = '\x01';
      Solver::setDecisionVar
                (in_stack_fffffffffffffd60,in_stack_fffffffffffffd5c,
                 SUB41((uint)in_stack_fffffffffffffd58 >> 0x18,0));
      *(int *)((long)in_RDI + 0x4cc) = *(int *)((long)in_RDI + 0x4cc) + 1;
      iVar2 = vec<unsigned_int>::size(&local_30);
      iVar3 = vec<unsigned_int>::size(&local_40);
      if (iVar3 < iVar2) {
        for (local_6c = 0; iVar2 = vec<unsigned_int>::size(&local_40), local_6c < iVar2;
            local_6c = local_6c + 1) {
          vec<unsigned_int>::operator[](&local_40,local_6c);
          ClauseAllocator::operator[]
                    ((ClauseAllocator *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd4c);
          mkElimClause((vec<unsigned_int> *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd8c,
                       in_stack_fffffffffffffd80);
        }
        mkLit(local_14,false);
        mkElimClause((vec<unsigned_int> *)
                     CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),
                     (Lit)(int)((ulong)in_stack_fffffffffffffd60 >> 0x20));
      }
      else {
        for (local_74 = 0; iVar2 = vec<unsigned_int>::size(&local_30), local_74 < iVar2;
            local_74 = local_74 + 1) {
          vec<unsigned_int>::operator[](&local_30,local_74);
          ClauseAllocator::operator[]
                    ((ClauseAllocator *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd4c);
          mkElimClause((vec<unsigned_int> *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd8c,
                       in_stack_fffffffffffffd80);
        }
        LVar4 = mkLit(local_14,false);
        operator~(LVar4);
        mkElimClause((vec<unsigned_int> *)
                     CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),
                     (Lit)(int)((ulong)in_stack_fffffffffffffd60 >> 0x20));
      }
      for (local_8c = 0; iVar2 = vec<unsigned_int>::size(&local_30), local_8c < iVar2;
          local_8c = local_8c + 1) {
        for (local_90 = 0; iVar2 = vec<unsigned_int>::size(&local_40), local_90 < iVar2;
            local_90 = local_90 + 1) {
          vec<unsigned_int>::operator[](&local_30,local_8c);
          ClauseAllocator::operator[]
                    ((ClauseAllocator *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd4c);
          in_stack_fffffffffffffde8 = (SimpSolver *)(in_RDI + 0x68);
          vec<unsigned_int>::operator[](&local_40,local_90);
          in_stack_fffffffffffffde0 =
               ClauseAllocator::operator[]
                         ((ClauseAllocator *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd4c);
          in_stack_fffffffffffffddf =
               merge(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,
                     (Clause *)
                     CONCAT17(in_stack_fffffffffffffddf,
                              CONCAT16(in_stack_fffffffffffffdde,
                                       CONCAT24(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8)
                                      )),in_stack_fffffffffffffdd4,in_stack_fffffffffffffdc8);
          if (((bool)in_stack_fffffffffffffddf) &&
             (in_stack_fffffffffffffdde = (**(code **)(*in_RDI + 0x20))(in_RDI,in_RDI + 0x84),
             (in_stack_fffffffffffffdde & 1) == 0)) {
            local_1 = false;
            goto LAB_0012c734;
          }
        }
      }
      local_94 = 0;
      while( true ) {
        iVar2 = local_94;
        iVar3 = vec<unsigned_int>::size(local_20);
        verbose = (undefined1)((ulong)in_stack_fffffffffffffde0 >> 0x38);
        if (iVar3 <= iVar2) break;
        vec<unsigned_int>::operator[](local_20,local_94);
        removeClause(in_stack_fffffffffffffd90,in_stack_fffffffffffffd8c,
                     (bool)in_stack_fffffffffffffd8b);
        local_94 = local_94 + 1;
      }
      OccLists<int,_Glucose::vec<unsigned_int>,_Glucose::SimpSolver::ClauseDeleted>::operator[]
                (in_stack_fffffffffffffd50,
                 (int *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
      dealloc = (undefined1)(in_stack_fffffffffffffd4c >> 0x18);
      vec<unsigned_int>::clear((vec<unsigned_int> *)in_stack_fffffffffffffd50,(bool)dealloc);
      mkLit(local_14,false);
      pvVar6 = OccLists<Glucose::Lit,_Glucose::vec<Glucose::Solver::Watcher>,_Glucose::Solver::WatcherDeleted>
               ::operator[]((OccLists<Glucose::Lit,_Glucose::vec<Glucose::Solver::Watcher>,_Glucose::Solver::WatcherDeleted>
                             *)in_stack_fffffffffffffd60,
                            (Lit *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
      iVar2 = vec<Glucose::Solver::Watcher>::size(pvVar6);
      if (iVar2 == 0) {
        mkLit(local_14,false);
        OccLists<Glucose::Lit,_Glucose::vec<Glucose::Solver::Watcher>,_Glucose::Solver::WatcherDeleted>
        ::operator[]((OccLists<Glucose::Lit,_Glucose::vec<Glucose::Solver::Watcher>,_Glucose::Solver::WatcherDeleted>
                      *)in_stack_fffffffffffffd60,
                     (Lit *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
        vec<Glucose::Solver::Watcher>::clear
                  ((vec<Glucose::Solver::Watcher> *)in_stack_fffffffffffffd50,(bool)dealloc);
      }
      LVar4 = mkLit(local_14,false);
      operator~(LVar4);
      pvVar6 = OccLists<Glucose::Lit,_Glucose::vec<Glucose::Solver::Watcher>,_Glucose::Solver::WatcherDeleted>
               ::operator[]((OccLists<Glucose::Lit,_Glucose::vec<Glucose::Solver::Watcher>,_Glucose::Solver::WatcherDeleted>
                             *)in_stack_fffffffffffffd60,
                            (Lit *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
      iVar2 = vec<Glucose::Solver::Watcher>::size(pvVar6);
      if (iVar2 == 0) {
        this_00 = (OccLists<Glucose::Lit,_Glucose::vec<Glucose::Solver::Watcher>,_Glucose::Solver::WatcherDeleted>
                   *)(in_RDI + 0x2c);
        LVar4 = mkLit(local_14,false);
        LVar4 = operator~(LVar4);
        pvVar6 = OccLists<Glucose::Lit,_Glucose::vec<Glucose::Solver::Watcher>,_Glucose::Solver::WatcherDeleted>
                 ::operator[](this_00,(Lit *)CONCAT44(LVar4.x,in_stack_fffffffffffffd58));
        vec<Glucose::Solver::Watcher>::clear(pvVar6,(bool)dealloc);
      }
      local_1 = backwardSubsumptionCheck(in_stack_fffffffffffffde8,(bool)verbose);
LAB_0012c734:
      vec<unsigned_int>::~vec((vec<unsigned_int> *)0x12c741);
      vec<unsigned_int>::~vec((vec<unsigned_int> *)0x12c74e);
      return (bool)(local_1 & 1);
    }
    for (local_64 = 0; iVar2 = vec<unsigned_int>::size(&local_40), local_64 < iVar2;
        local_64 = local_64 + 1) {
      vec<unsigned_int>::operator[](&local_30,local_60);
      ClauseAllocator::operator[]
                ((ClauseAllocator *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd4c);
      vec<unsigned_int>::operator[](&local_40,local_64);
      ClauseAllocator::operator[]
                ((ClauseAllocator *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd4c);
      bVar1 = merge((SimpSolver *)
                    CONCAT17(in_stack_fffffffffffffddf,
                             CONCAT16(in_stack_fffffffffffffdde,
                                      CONCAT24(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8))
                            ),
                    (Clause *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                    (Clause *)in_stack_fffffffffffffdc8,
                    (Var)((ulong)in_stack_fffffffffffffdc0 >> 0x20),
                    (int *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
      if (bVar1) {
        local_58 = local_58 + 1;
        iVar2 = vec<unsigned_int>::size(local_20);
        if ((iVar2 + *(int *)((long)in_RDI + 0x4ac) < local_58) ||
           (((int)in_RDI[0x96] != -1 && ((int)in_RDI[0x96] < 0)))) {
          local_1 = true;
          goto LAB_0012c734;
        }
      }
    }
    local_60 = local_60 + 1;
  } while( true );
}

Assistant:

bool SimpSolver::eliminateVar(Var v)
{
    assert(!frozen[v]);
    assert(!isEliminated(v));
    assert(value(v) == l_Undef);

    // Split the occurrences into positive and negative:
    //
    const vec<CRef>& cls = occurs.lookup(v);
    vec<CRef>        pos, neg;
    for (int i = 0; i < cls.size(); i++)
        (find(ca[cls[i]], mkLit(v)) ? pos : neg).push(cls[i]);

    // Check wether the increase in number of clauses stays within the allowed ('grow'). Moreover, no
    // clause must exceed the limit on the maximal clause size (if it is set):
    //
    int cnt         = 0;
    int clause_size = 0;

    for (int i = 0; i < pos.size(); i++)
        for (int j = 0; j < neg.size(); j++)
            if (merge(ca[pos[i]], ca[neg[j]], v, clause_size) && 
                (++cnt > cls.size() + grow || (clause_lim != -1 && clause_size > clause_lim)))
                return true;

    // Delete and store old clauses
    eliminated[v] = true;
    setDecisionVar(v, false);
    eliminated_vars++;

    if (pos.size() > neg.size()){
        for (int i = 0; i < neg.size(); i++)
            mkElimClause(elimclauses, v, ca[neg[i]]);
        mkElimClause(elimclauses, mkLit(v));
    }else{
        for (int i = 0; i < pos.size(); i++)
            mkElimClause(elimclauses, v, ca[pos[i]]);
        mkElimClause(elimclauses, ~mkLit(v));
    }


    // Produce clauses in cross product:
    vec<Lit>& resolvent = add_tmp;
    for (int i = 0; i < pos.size(); i++)
        for (int j = 0; j < neg.size(); j++)
            if (merge(ca[pos[i]], ca[neg[j]], v, resolvent) && !addClause_(resolvent))
                return false;

    for (int i = 0; i < cls.size(); i++)
        removeClause(cls[i]);

    // Free occurs list for this variable:
    occurs[v].clear(true);

    // Free watchers lists for this variable, if possible:
    if (watches[ mkLit(v)].size() == 0) watches[ mkLit(v)].clear(true);
    if (watches[~mkLit(v)].size() == 0) watches[~mkLit(v)].clear(true);

    return backwardSubsumptionCheck();
}